

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O1

QDataStream * __thiscall QDataStream::writeBytes(QDataStream *this,char *s,qint64 len)

{
  bool bVar1;
  ssize_t sVar2;
  undefined7 in_register_00000009;
  qint32 i;
  
  if (len < 0) goto LAB_002f08d4;
  if (this->dev == (QIODevice *)0x0) {
    return this;
  }
  if (this->q_status != '\0') {
    return this;
  }
  if (len < 0xfffffffe) {
    i = (qint32)len;
LAB_002f08c9:
    operator<<(this,i);
LAB_002f08f9:
    bVar1 = true;
  }
  else {
    if (0x15 < this->ver) {
      operator<<(this,-2);
      operator<<(this,len);
      goto LAB_002f08f9;
    }
    if (len == 0xfffffffe) {
      i = -2;
      goto LAB_002f08c9;
    }
    this->q_status = '\x04';
    bVar1 = false;
  }
  if (!bVar1 || len == 0) {
    return this;
  }
  if (this->dev == (QIODevice *)0x0) {
    return this;
  }
  if (this->q_status != '\0') {
    return this;
  }
  sVar2 = QIODevice::write(this->dev,(int)s,(void *)len,CONCAT71(in_register_00000009,len == 0));
  if (sVar2 == len) {
    return this;
  }
LAB_002f08d4:
  this->q_status = '\x03';
  return this;
}

Assistant:

QDataStream &QDataStream::writeBytes(const char *s, qint64 len)
{
    if (len < 0) {
        q_status = WriteFailed;
        return *this;
    }
    CHECK_STREAM_WRITE_PRECOND(*this)
    // Write length then, if any, content
    if (writeQSizeType(*this, len) && len > 0)
        writeRawData(s, len);
    return *this;
}